

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

ZSTD_CCtx_params * ZSTD_createCCtxParams(void)

{
  ZSTD_customMem customMem;
  ZSTD_CCtx_params *pZVar1;
  void *in_stack_fffffffffffffff0;
  
  customMem.opaque = in_stack_fffffffffffffff0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  pZVar1 = ZSTD_createCCtxParams_advanced(customMem);
  return pZVar1;
}

Assistant:

ZSTD_CCtx_params* ZSTD_createCCtxParams(void)
{
    return ZSTD_createCCtxParams_advanced(ZSTD_defaultCMem);
}